

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::
     VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)2,duckdb::GenericArgMinMaxState<(duckdb::OrderType)2>>
     ::Update<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>>
               (Vector *inputs,AggregateInputData *param_2,idx_t input_count,Vector *state_vector,
               idx_t count)

{
  string_t new_value;
  string_t new_value_00;
  uint uVar1;
  string_t *psVar2;
  idx_t iVar3;
  long in_RDI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_R8;
  ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *state_1;
  idx_t sidx_1;
  idx_t i_1;
  string_t *sort_key_data;
  Vector sliced_input;
  SelectionVector sel;
  OrderModifiers modifiers;
  Vector sort_key;
  ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *state;
  idx_t sidx;
  bool arg_null;
  idx_t aidx;
  string_t bval;
  idx_t bidx;
  idx_t i;
  ArgMinMaxState<duckdb::string_t,_duckdb::string_t> **states;
  idx_t assign_count;
  sel_t assign_sel [2048];
  ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *last_state;
  UnifiedVectorFormat sdata;
  string_t *bys;
  Vector extra_state;
  UnifiedVectorFormat bdata;
  Vector *by;
  UnifiedVectorFormat adata;
  Vector *arg;
  UnifiedVectorFormat *in_stack_ffffffffffffdc98;
  Vector *in_stack_ffffffffffffdca0;
  undefined5 in_stack_ffffffffffffdca8;
  undefined1 in_stack_ffffffffffffdcad;
  undefined1 in_stack_ffffffffffffdcae;
  undefined1 in_stack_ffffffffffffdcaf;
  Vector *by_00;
  sel_t *in_stack_ffffffffffffdcb8;
  LogicalType *in_stack_ffffffffffffdcc0;
  idx_t in_stack_ffffffffffffdcc8;
  SelectionVector *in_stack_ffffffffffffdcd0;
  Vector *in_stack_ffffffffffffdcd8;
  Vector *in_stack_ffffffffffffdce0;
  idx_t idx;
  Vector *in_stack_ffffffffffffdcf8;
  idx_t in_stack_ffffffffffffdd00;
  Vector *in_stack_ffffffffffffdd08;
  OrderModifiers in_stack_ffffffffffffdd16;
  UnifiedVectorFormat *in_stack_ffffffffffffdd60;
  element_type *in_stack_ffffffffffffdd68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffdd70;
  OrderModifiers local_2282 [67];
  undefined4 local_21fc;
  undefined8 local_21f8;
  char *pcStack_21f0;
  ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *local_21e8;
  idx_t local_21e0;
  byte local_21d1;
  idx_t local_21d0;
  undefined8 local_21c8;
  char *pcStack_21c0;
  idx_t local_21b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_21b0;
  ArgMinMaxState<duckdb::string_t,_duckdb::string_t> **local_21a8;
  ulong local_21a0;
  uint local_2198 [2048];
  ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *local_198;
  UnifiedVectorFormat local_190;
  string_t *local_148;
  UnifiedVectorFormat local_d8;
  long local_90;
  SelectionVector *local_78 [10];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  long local_8;
  
  by_00 = (Vector *)local_78;
  local_28._M_pi = in_R8;
  local_8 = in_RDI;
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)by_00);
  Vector::ToUnifiedFormat
            ((Vector *)in_stack_ffffffffffffdd70._M_pi,(idx_t)in_stack_ffffffffffffdd68,
             in_stack_ffffffffffffdd60);
  local_90 = local_8 + 0x68;
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)by_00);
  GenericArgMinMaxState<(duckdb::OrderType)2>::CreateExtraState((idx_t)in_stack_ffffffffffffdcd8);
  GenericArgMinMaxState<(duckdb::OrderType)2>::PrepareData
            (by_00,CONCAT17(in_stack_ffffffffffffdcaf,
                            CONCAT16(in_stack_ffffffffffffdcae,
                                     CONCAT15(in_stack_ffffffffffffdcad,in_stack_ffffffffffffdca8)))
             ,in_stack_ffffffffffffdca0,in_stack_ffffffffffffdc98);
  local_148 = UnifiedVectorFormat::GetData<duckdb::string_t>(&local_d8);
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)by_00);
  Vector::ToUnifiedFormat
            ((Vector *)in_stack_ffffffffffffdd70._M_pi,(idx_t)in_stack_ffffffffffffdd68,
             in_stack_ffffffffffffdd60);
  local_198 = (ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *)0x0;
  local_21a0 = 0;
  local_21a8 = UnifiedVectorFormat::
               GetData<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>*>(&local_190);
  for (local_21b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0; local_21b0 < local_28._M_pi
      ; local_21b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&local_21b0->_vptr__Sp_counted_base + 1)) {
    local_21b8 = SelectionVector::get_index(local_d8.sel,(idx_t)local_21b0);
    in_stack_ffffffffffffdcaf =
         TemplatedValidityMask<unsigned_long>::RowIsValid
                   ((TemplatedValidityMask<unsigned_long> *)
                    CONCAT17(in_stack_ffffffffffffdcaf,
                             CONCAT16(in_stack_ffffffffffffdcae,
                                      CONCAT15(in_stack_ffffffffffffdcad,in_stack_ffffffffffffdca8))
                            ),(idx_t)in_stack_ffffffffffffdca0);
    if ((bool)in_stack_ffffffffffffdcaf) {
      local_21c8 = *(undefined8 *)&local_148[local_21b8].value;
      pcStack_21c0 = local_148[local_21b8].value.pointer.ptr;
      local_21d0 = SelectionVector::get_index(local_78[0],(idx_t)local_21b0);
      in_stack_ffffffffffffdcae =
           TemplatedValidityMask<unsigned_long>::RowIsValid
                     ((TemplatedValidityMask<unsigned_long> *)
                      CONCAT17(in_stack_ffffffffffffdcaf,
                               CONCAT16(in_stack_ffffffffffffdcae,
                                        CONCAT15(in_stack_ffffffffffffdcad,in_stack_ffffffffffffdca8
                                                ))),(idx_t)in_stack_ffffffffffffdca0);
      local_21d1 = (in_stack_ffffffffffffdcae ^ 0xff) & 1;
      local_21e0 = SelectionVector::get_index(local_190.sel,(idx_t)local_21b0);
      local_21e8 = local_21a8[local_21e0];
      if ((((local_21e8->super_ArgMinMaxStateBase).is_initialized & 1U) == 0) ||
         (in_stack_ffffffffffffdcad =
               LessThan::Operation<duckdb::string_t>
                         ((string_t *)in_stack_ffffffffffffdca0,
                          (string_t *)in_stack_ffffffffffffdc98), (bool)in_stack_ffffffffffffdcad))
      {
        local_21f8 = local_21c8;
        pcStack_21f0 = pcStack_21c0;
        new_value.value.pointer.ptr = (char *)in_stack_ffffffffffffdcd0;
        new_value.value._0_8_ = in_stack_ffffffffffffdcc8;
        ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                  ((string_t *)in_stack_ffffffffffffdcc0,new_value);
        (local_21e8->super_ArgMinMaxStateBase).arg_null = (bool)(local_21d1 & 1);
        if ((local_21d1 & 1) == 0) {
          if (local_21e8 == local_198) {
            local_21a0 = local_21a0 - 1;
          }
          uVar1 = UnsafeNumericCast<unsigned_int,unsigned_long,void>((unsigned_long)local_21b0);
          local_2198[local_21a0] = uVar1;
          local_198 = local_21e8;
          local_21a0 = local_21a0 + 1;
        }
        (local_21e8->super_ArgMinMaxStateBase).is_initialized = true;
      }
    }
  }
  if (local_21a0 == 0) {
    local_21fc = 1;
  }
  else {
    LogicalType::LogicalType
              (in_stack_ffffffffffffdcc0,(LogicalTypeId)((ulong)in_stack_ffffffffffffdcb8 >> 0x38));
    Vector::Vector(in_stack_ffffffffffffdce0,(LogicalType *)in_stack_ffffffffffffdcd8,
                   (idx_t)in_stack_ffffffffffffdcd0);
    LogicalType::~LogicalType((LogicalType *)0x1c39007);
    OrderModifiers::OrderModifiers(local_2282,ASCENDING,NULLS_LAST);
    SelectionVector::SelectionVector
              ((SelectionVector *)in_stack_ffffffffffffdcc0,in_stack_ffffffffffffdcb8);
    Vector::Vector(in_stack_ffffffffffffdce0,in_stack_ffffffffffffdcd8,in_stack_ffffffffffffdcd0,
                   in_stack_ffffffffffffdcc8);
    CreateSortKeyHelpers::CreateSortKey
              (in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,in_stack_ffffffffffffdd16,
               in_stack_ffffffffffffdcf8);
    psVar2 = FlatVector::GetData<duckdb::string_t>((Vector *)0x1c39096);
    for (idx = 0; idx < local_21a0; idx = idx + 1) {
      in_stack_ffffffffffffdca0 = (Vector *)local_190.sel;
      iVar3 = SelectionVector::get_index((SelectionVector *)&stack0xffffffffffffdd60,idx);
      iVar3 = SelectionVector::get_index((SelectionVector *)in_stack_ffffffffffffdca0,iVar3);
      new_value_00.value.pointer.ptr = (char *)local_21a8[iVar3];
      new_value_00.value._0_8_ = in_stack_ffffffffffffdcc8;
      ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                ((string_t *)psVar2[idx].value.pointer.ptr,new_value_00);
    }
    Vector::~Vector(in_stack_ffffffffffffdca0);
    SelectionVector::~SelectionVector((SelectionVector *)0x1c391d3);
    Vector::~Vector(in_stack_ffffffffffffdca0);
    local_21fc = 0;
  }
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_ffffffffffffdca0);
  Vector::~Vector(in_stack_ffffffffffffdca0);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_ffffffffffffdca0);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_ffffffffffffdca0);
  return;
}

Assistant:

static void Update(Vector inputs[], AggregateInputData &, idx_t input_count, Vector &state_vector, idx_t count) {
		auto &arg = inputs[0];
		UnifiedVectorFormat adata;
		arg.ToUnifiedFormat(count, adata);

		using ARG_TYPE = typename STATE::ARG_TYPE;
		using BY_TYPE = typename STATE::BY_TYPE;
		auto &by = inputs[1];
		UnifiedVectorFormat bdata;
		auto extra_state = UPDATE_TYPE::CreateExtraState(count);
		UPDATE_TYPE::PrepareData(by, count, extra_state, bdata);
		const auto bys = UnifiedVectorFormat::GetData<BY_TYPE>(bdata);

		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);

		STATE *last_state = nullptr;
		sel_t assign_sel[STANDARD_VECTOR_SIZE];
		idx_t assign_count = 0;

		auto states = UnifiedVectorFormat::GetData<STATE *>(sdata);
		for (idx_t i = 0; i < count; i++) {
			const auto bidx = bdata.sel->get_index(i);
			if (!bdata.validity.RowIsValid(bidx)) {
				continue;
			}
			const auto bval = bys[bidx];

			const auto aidx = adata.sel->get_index(i);
			const auto arg_null = !adata.validity.RowIsValid(aidx);
			if (IGNORE_NULL && arg_null) {
				continue;
			}

			const auto sidx = sdata.sel->get_index(i);
			auto &state = *states[sidx];
			if (!state.is_initialized || COMPARATOR::template Operation<BY_TYPE>(bval, state.value)) {
				STATE::template AssignValue<BY_TYPE>(state.value, bval);
				state.arg_null = arg_null;
				// micro-adaptivity: it is common we overwrite the same state repeatedly
				// e.g. when running arg_max(val, ts) and ts is sorted in ascending order
				// this check essentially says:
				// "if we are overriding the same state as the last row, the last write was pointless"
				// hence we skip the last write altogether
				if (!arg_null) {
					if (&state == last_state) {
						assign_count--;
					}
					assign_sel[assign_count++] = UnsafeNumericCast<sel_t>(i);
					last_state = &state;
				}
				state.is_initialized = true;
			}
		}
		if (assign_count == 0) {
			// no need to assign anything: nothing left to do
			return;
		}
		Vector sort_key(LogicalType::BLOB);
		auto modifiers = OrderModifiers(ORDER_TYPE, OrderByNullType::NULLS_LAST);
		// slice with a selection vector and generate sort keys
		SelectionVector sel(assign_sel);
		Vector sliced_input(arg, sel, assign_count);
		CreateSortKeyHelpers::CreateSortKey(sliced_input, assign_count, modifiers, sort_key);
		auto sort_key_data = FlatVector::GetData<string_t>(sort_key);

		// now assign sort keys
		for (idx_t i = 0; i < assign_count; i++) {
			const auto sidx = sdata.sel->get_index(sel.get_index(i));
			auto &state = *states[sidx];
			STATE::template AssignValue<ARG_TYPE>(state.arg, sort_key_data[i]);
		}
	}